

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O3

void __thiscall
xLearn::FMScore::CalcGrad(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  Logger local_64;
  string local_60;
  string local_40;
  
  psVar1 = &(this->super_Score).opt_type_;
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar2 == 0) {
    calc_grad_sgd(this,row,model,pg,norm);
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 != 0) {
      local_64.severity_ = FATAL;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/fm_score.cc"
                 ,"");
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CalcGrad","");
      poVar3 = Logger::Start(FATAL,&local_40,0x76,&local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Unknow optimization method: ",0x1c)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(this->super_Score).opt_type_._M_dataplus._M_p,
                 (this->super_Score).opt_type_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      Logger::~Logger(&local_64);
      return;
    }
    calc_grad_ftrl(this,row,model,pg,norm);
    return;
  }
  calc_grad_adagrad(this,row,model,pg,norm);
  return;
}

Assistant:

void FMScore::CalcGrad(const SparseRow* row,
                       Model& model,
                       real_t pg,
                       real_t norm) {
  // Using sgd
  if (opt_type_.compare("sgd") == 0) {
    this->calc_grad_sgd(row, model, pg, norm);
  }
  // Using adagrad
  else if (opt_type_.compare("adagrad") == 0) {
    this->calc_grad_adagrad(row, model, pg, norm);
  }
  // Using ftrl 
  else if (opt_type_.compare("ftrl") == 0) {
    this->calc_grad_ftrl(row, model, pg, norm);
  }
  else {
    LOG(FATAL) << "Unknow optimization method: " << opt_type_;
  }
}